

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O2

void Abc_TruthDecPerform(Abc_TtStore_t *p,int DecType,int fVerbose)

{
  word *pwVar1;
  word *pwVar2;
  uint uVar3;
  word *pInit;
  byte bVar4;
  abctime aVar5;
  Vec_Str_t *vStr;
  Vec_Int_t *vCover;
  int *piVar6;
  Dec_Graph_t *pGraph;
  Bdc_Man_t *p_00;
  abctime aVar7;
  ulong uVar8;
  Kit_DsdNtk_t *pNtk;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  word *pwVar16;
  ulong uVar17;
  word *pwVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  undefined4 in_stack_fffffffffffff7d8;
  char pDsd [2000];
  
  aVar5 = Abc_Clock();
  if (DecType == 1) {
    pcVar13 = "factoring";
  }
  else {
    if (3 < DecType - 2U) goto LAB_0023f742;
    pcVar13 = &DAT_006e8a10 + *(int *)(&DAT_006e8a10 + (ulong)(DecType - 2U) * 4);
  }
  pcVar9 = "s";
  if (p->nFuncs == 1) {
    pcVar9 = "";
  }
  printf("Applying %-10s to %8d func%s of %2d vars...  ",pcVar13,(ulong)(uint)p->nFuncs,pcVar9);
LAB_0023f742:
  if (fVerbose != 0) {
    putchar(10);
  }
  if (DecType == 1) {
    vStr = (Vec_Str_t *)malloc(0x10);
    vStr->nCap = 10000;
    vStr->nSize = 0;
    pcVar13 = (char *)malloc(10000);
    vStr->pArray = pcVar13;
    vCover = (Vec_Int_t *)malloc(0x10);
    vCover->nCap = 0x10000;
    vCover->nSize = 0;
    piVar6 = (int *)malloc(0x40000);
    vCover->pArray = piVar6;
    uVar12 = 0;
    for (uVar20 = 0; (long)uVar20 < (long)p->nFuncs; uVar20 = uVar20 + 1) {
      if (fVerbose != 0) {
        printf("%7d : ",uVar20 & 0xffffffff);
      }
      pcVar13 = Kit_PlaFromTruthNew((uint *)p->pFuncs[uVar20],p->nVars,vCover,vStr);
      pGraph = Dec_Factor(pcVar13);
      uVar12 = (ulong)(uint)(((int)uVar12 + pGraph->nSize) - pGraph->nLeaves);
      if (fVerbose != 0) {
        Dec_GraphPrint(_stdout,pGraph,(char **)0x0,(char *)0x0);
      }
      free(pGraph->pNodes);
      free(pGraph);
    }
    free(vCover->pArray);
    free(vCover);
    free(vStr->pArray);
    free(vStr);
  }
  else {
    switch(DecType) {
    case 2:
      pDsd[4] = '\0';
      pDsd[5] = '\0';
      pDsd[6] = '\0';
      pDsd[7] = '\0';
      pDsd[8] = '\0';
      pDsd[9] = '\0';
      pDsd[10] = '\0';
      pDsd[0xb] = '\0';
      pDsd._0_4_ = p->nVars;
      p_00 = Bdc_ManAlloc((Bdc_Par_t *)pDsd);
      uVar12 = 0;
      for (uVar20 = 0; (long)uVar20 < (long)p->nFuncs; uVar20 = uVar20 + 1) {
        if (fVerbose != 0) {
          printf("%7d :      ",uVar20 & 0xffffffff);
        }
        Bdc_ManDecompose(p_00,(uint *)p->pFuncs[uVar20],(uint *)0x0,p->nVars,(Vec_Ptr_t *)0x0,1000);
        iVar19 = Bdc_ManAndNum(p_00);
        if (fVerbose != 0) {
          Bdc_ManDecPrint(p_00);
        }
        uVar12 = (ulong)(uint)((int)uVar12 + iVar19);
      }
      Bdc_ManFree(p_00);
      break;
    case 3:
      uVar12 = 0;
      for (uVar20 = 0; (long)uVar20 < (long)p->nFuncs; uVar20 = uVar20 + 1) {
        if (fVerbose != 0) {
          printf("%7d :      ",uVar20 & 0xffffffff);
        }
        pNtk = Kit_DsdDecomposeMux((uint *)p->pFuncs[uVar20],p->nVars,3);
        if (fVerbose != 0) {
          Kit_DsdPrintExpanded(pNtk);
          putchar(10);
        }
        iVar19 = Kit_DsdCountAigNodes(pNtk);
        uVar12 = (ulong)(uint)((int)uVar12 + iVar19);
        Kit_DsdNtkFree(pNtk);
      }
      break;
    case 4:
      uVar12 = 0;
      for (uVar20 = 0; (long)uVar20 < (long)p->nFuncs; uVar20 = uVar20 + 1) {
        if (fVerbose == 0) {
          Dau_DsdDecompose(p->pFuncs[uVar20],p->nVars,0,1,pDsd);
        }
        else {
          printf("%7d :      ",uVar20 & 0xffffffff);
          Dau_DsdDecompose(p->pFuncs[uVar20],p->nVars,0,1,pDsd);
          puts(pDsd);
        }
        iVar19 = Dau_DsdCountAnds((char *)CONCAT44(fVerbose,in_stack_fffffffffffff7d8));
        uVar12 = (ulong)(uint)((int)uVar12 + iVar19);
      }
      break;
    case 5:
      for (uVar12 = 0; (long)uVar12 < (long)p->nFuncs; uVar12 = uVar12 + 1) {
        uVar3 = p->nVars;
        uVar10 = 1 << ((char)uVar3 - 6U & 0x1f);
        pInit = p->pFuncs[uVar12];
        uVar8 = 0;
        uVar20 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar20 = uVar8;
        }
        uVar17 = 0;
        if (0 < (int)uVar3) {
          uVar17 = (ulong)uVar3;
        }
        iVar19 = 0;
        for (; uVar8 != uVar17; uVar8 = uVar8 + 1) {
          bVar4 = (byte)uVar8;
          if ((int)uVar3 < 7) {
            if ((s_Truths6Neg[uVar8] & (*pInit >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^ *pInit)) !=
                0) {
LAB_0023faa7:
              iVar19 = iVar19 + 1;
            }
          }
          else {
            if (uVar8 < 6) {
              uVar15 = 0;
              do {
                if (uVar20 == uVar15) goto LAB_0023faaa;
                pwVar18 = pInit + uVar15;
                uVar15 = uVar15 + 1;
              } while ((s_Truths6Neg[uVar8] &
                       (*pwVar18 >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^ *pwVar18)) == 0);
              goto LAB_0023faa7;
            }
            uVar11 = 1 << (bVar4 - 6 & 0x1f);
            iVar14 = 2 << (bVar4 - 6 & 0x1f);
            uVar15 = 0;
            if (0 < (int)uVar11) {
              uVar15 = (ulong)uVar11;
            }
            pwVar18 = pInit + (int)uVar11;
            for (pwVar16 = pInit; pwVar16 < pInit + (int)uVar10; pwVar16 = pwVar16 + iVar14) {
              uVar21 = 0;
              while (uVar15 != uVar21) {
                pwVar1 = pwVar16 + uVar21;
                pwVar2 = pwVar18 + uVar21;
                uVar21 = uVar21 + 1;
                if (*pwVar1 != *pwVar2) goto LAB_0023faa7;
              }
              pwVar18 = pwVar18 + iVar14;
            }
          }
LAB_0023faaa:
        }
        if (fVerbose == 0) {
          Dau_DecTrySets(pInit,iVar19,0);
        }
        else {
          iVar14 = fVerbose;
          printf("%7d :      ",uVar12 & 0xffffffff);
          Dau_DecTrySets(p->pFuncs[uVar12],iVar19,fVerbose);
          putchar(10);
          fVerbose = iVar14;
        }
      }
      uVar12 = 0;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcDec.c"
                    ,0x245,"void Abc_TruthDecPerform(Abc_TtStore_t *, int, int)");
    }
  }
  printf("AIG nodes =%9d  ",uVar12);
  aVar7 = Abc_Clock();
  Abc_Print(1,"%s =","Time");
  Abc_Print(1,"%9.2f sec\n",(double)(aVar7 - aVar5) / 1000000.0);
  return;
}

Assistant:

void Abc_TruthDecPerform( Abc_TtStore_t * p, int DecType, int fVerbose )
{
    abctime clk = Abc_Clock();
    int i, nNodes = 0;

    char * pAlgoName = NULL;
    if ( DecType == 1 )
        pAlgoName = "factoring";
    else if ( DecType == 2 )
        pAlgoName = "bi-decomp";
    else if ( DecType == 3 )
        pAlgoName = "DSD";
    else if ( DecType == 4 )
        pAlgoName = "fast DSD";
    else if ( DecType == 5 )
        pAlgoName = "analysis";

    if ( pAlgoName )
        printf( "Applying %-10s to %8d func%s of %2d vars...  ",  
            pAlgoName, p->nFuncs, (p->nFuncs == 1 ? "":"s"), p->nVars );
    if ( fVerbose )
        printf( "\n" );

    if ( DecType == 1 )
    {
        // perform algebraic factoring and count AIG nodes
        Dec_Graph_t * pFForm;
        Vec_Int_t * vCover;
        Vec_Str_t * vStr;
        char * pSopStr;
        vStr = Vec_StrAlloc( 10000 );
        vCover = Vec_IntAlloc( 1 << 16 );
        for ( i = 0; i < p->nFuncs; i++ )
        {
//            extern int Abc_IsopTest( word * pFunc, int nVars, Vec_Int_t * vCover );
//            if ( i == 0 ) printf( "\n" );
//            Abc_IsopTest( p->pFuncs[i], p->nVars, vCover );
//            continue;
            if ( fVerbose )
                printf( "%7d : ", i );
            pSopStr = Kit_PlaFromTruthNew( (unsigned *)p->pFuncs[i], p->nVars, vCover, vStr );
            pFForm = Dec_Factor( pSopStr );
            nNodes += Dec_GraphNodeNum( pFForm );
            if ( fVerbose )
                Dec_GraphPrint( stdout, pFForm, NULL, NULL );
            Dec_GraphFree( pFForm );
        }
        Vec_IntFree( vCover );
        Vec_StrFree( vStr );
    }
    else if ( DecType == 2 )
    {
        // perform bi-decomposition and count AIG nodes
        Bdc_Man_t * pManDec;
        Bdc_Par_t Pars = {0}, * pPars = &Pars;
        pPars->nVarsMax = p->nVars;
        pManDec = Bdc_ManAlloc( pPars );
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Bdc_ManDecompose( pManDec, (unsigned *)p->pFuncs[i], NULL, p->nVars, NULL, 1000 );
            nNodes += Bdc_ManAndNum( pManDec );
            if ( fVerbose )
                Bdc_ManDecPrint( pManDec );
        }
        Bdc_ManFree( pManDec );
    }
    else if ( DecType == 3 )
    {
        // perform disjoint-support decomposition and count AIG nodes
        // (non-DSD blocks are decomposed into 2:1 MUXes, each counting as 3 AIG nodes)
        Kit_DsdNtk_t * pNtk;
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            pNtk = Kit_DsdDecomposeMux( (unsigned *)p->pFuncs[i], p->nVars, 3 );
            if ( fVerbose )
                Kit_DsdPrintExpanded( pNtk ), printf( "\n" );
            nNodes += Kit_DsdCountAigNodes( pNtk );
            Kit_DsdNtkFree( pNtk );
        }
    }
    else if ( DecType == 4 )
    {
        char pDsd[DAU_MAX_STR];
        for ( i = 0; i < p->nFuncs; i++ )
        {
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dau_DsdDecompose( p->pFuncs[i], p->nVars, 0, 1, pDsd );
            if ( fVerbose )
                printf( "%s\n", pDsd );
            nNodes += Dau_DsdCountAnds( pDsd );
        }
    }
    else if ( DecType == 5 )
    {
        for ( i = 0; i < p->nFuncs; i++ )
        {
            extern void Dau_DecTrySets( word * pInit, int nVars, int fVerbose );
            int nSuppSize = Abc_TtSupportSize( p->pFuncs[i], p->nVars );
            if ( fVerbose )
                printf( "%7d :      ", i );
            Dau_DecTrySets( p->pFuncs[i], nSuppSize, fVerbose );
            if ( fVerbose )
                printf( "\n" );
        }
    }
    else assert( 0 );

    printf( "AIG nodes =%9d  ", nNodes );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}